

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  pointer *ppAVar2;
  pointer piVar3;
  pointer pcVar4;
  iterator __position;
  int iVar5;
  int iVar6;
  clock_t cVar7;
  ssize_t sVar8;
  runtime_error *this_00;
  long lVar9;
  undefined4 in_register_00000034;
  FILE *fin;
  long lVar10;
  int label;
  int i_v;
  int i_u;
  int nbtypes;
  char _error_msg_ [256];
  int local_164;
  int local_160;
  int local_15c;
  vector<Item,_std::allocator<Item>_> local_158;
  vector<Arc,_std::allocator<Arc>_> *local_140;
  Instance local_138;
  
  fin = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->ready == false) {
    cVar7 = clock();
    this->tstart = cVar7;
    Instance::Instance(&local_138,fin,MVP);
    (this->inst).n = local_138.n;
    (this->inst).ndims = local_138.ndims;
    (this->inst).nbtypes = local_138.nbtypes;
    (this->inst).nsizes = local_138.nsizes;
    (this->inst).m = local_138.m;
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(this->inst).Ws.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(this->inst).Ws.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(this->inst).Ws.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->inst).Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_138.Ws.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->inst).Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_138.Ws.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->inst).Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_138.Ws.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_138.Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.Ws.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_158);
    piVar3 = (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3);
    }
    piVar3 = (this->inst).Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->inst).Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->inst).Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->inst).Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3);
    }
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Item,_std::allocator<Item>_>::~vector(&local_158);
    *(uint *)((long)&(this->inst).method + 3) = CONCAT31(local_138._124_3_,local_138.method._3_1_);
    (this->inst).method = local_138.method;
    pcVar4 = (this->inst).ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->inst).ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->inst).ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->inst).ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    if (pcVar4 != (pointer)0x0) {
      operator_delete(pcVar4);
    }
    piVar3 = (this->inst).nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->inst).nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    (this->inst).nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    (this->inst).nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3);
    }
    piVar3 = (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3);
    }
    if (local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<Item,_std::allocator<Item>_>::~vector(&local_138.items);
    if (local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_138.Ws);
    iVar5 = __isoc99_fscanf(fin," #GRAPH_BEGIN#");
    if (iVar5 == 0) {
      iVar5 = __isoc99_fscanf(fin," $NBTYPES { %d } ;",&local_158);
      if (iVar5 == 1) {
        if ((int)local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_start == (this->inst).nbtypes) {
          iVar5 = __isoc99_fscanf(fin," $S { %d } ;",&this->S);
          if (iVar5 == 1) {
            std::vector<int,_std::allocator<int>_>::resize
                      (&this->Ts,
                       (long)(int)local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                  super__Vector_impl_data._M_start);
            iVar5 = __isoc99_fscanf(fin," $Ts { ");
            if (iVar5 == 0) {
              if (0 < (int)local_158.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                           super__Vector_impl_data._M_start) {
                lVar10 = 0;
                lVar9 = 0;
                do {
                  if (lVar9 != 0) {
                    iVar5 = __isoc99_fscanf(fin," ,");
                    if (iVar5 != 0) {
                      snprintf((char *)&local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" ,\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                               ,0x24a);
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,(char *)&local_138);
                      goto LAB_0010d155;
                    }
                  }
                  iVar5 = __isoc99_fscanf(fin,"%d",(long)(this->Ts).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar10)
                  ;
                  if (iVar5 != 1) {
                    snprintf((char *)&local_138,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &Ts[i]) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x24b);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,(char *)&local_138);
                    goto LAB_0010d155;
                  }
                  lVar9 = lVar9 + 1;
                  lVar10 = lVar10 + 4;
                } while (lVar9 < (int)local_158.super__Vector_base<Item,_std::allocator<Item>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              iVar5 = __isoc99_fscanf(fin," } ;");
              if (iVar5 == 0) {
                iVar5 = __isoc99_fscanf(fin," $LOSS { %d } ;",&this->LOSS);
                if (iVar5 == 1) {
                  iVar5 = __isoc99_fscanf(fin," $NV { %d } ;",&this->NV);
                  if (iVar5 == 1) {
                    piVar1 = &this->NA;
                    iVar5 = __isoc99_fscanf(fin," $NA { %d } ;",piVar1);
                    if (iVar5 == 1) {
                      iVar5 = __isoc99_fscanf(fin," $ARCS {");
                      if (iVar5 == 0) {
                        if (0 < *piVar1) {
                          local_140 = &this->A;
                          iVar5 = 0;
                          do {
                            iVar6 = __isoc99_fscanf(fin," %d %d %d ",&local_15c,&local_160,
                                                    &local_164);
                            if (iVar6 != 3) {
                              snprintf((char *)&local_138,0x100,
                                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                       "fscanf(fin, \" %d %d %d \", &i_u, &i_v, &label) == 3",
                                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                       ,600);
                              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this_00,(char *)&local_138);
                              goto LAB_0010d155;
                            }
                            local_138.ndims = local_15c;
                            local_138.nbtypes = local_160;
                            local_138.nsizes = local_164;
                            __position._M_current =
                                 (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (__position._M_current ==
                                (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                                        (local_140,__position,(Arc *)&local_138);
                            }
                            else {
                              (__position._M_current)->label = local_164;
                              (__position._M_current)->u = local_15c;
                              (__position._M_current)->v = local_160;
                              ppAVar2 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                              *ppAVar2 = *ppAVar2 + 1;
                            }
                            iVar5 = iVar5 + 1;
                          } while (iVar5 < *piVar1);
                        }
                        iVar5 = __isoc99_fscanf(fin," } ;");
                        if (iVar5 == 0) {
                          sVar8 = __isoc99_fscanf(fin," #GRAPH_END#");
                          if ((int)sVar8 == 0) {
                            this->ready = true;
                            return sVar8;
                          }
                          snprintf((char *)&local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" #GRAPH_END#\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                   ,0x25c);
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,(char *)&local_138);
                        }
                        else {
                          snprintf((char *)&local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" } ;\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                   ,0x25b);
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,(char *)&local_138);
                        }
                      }
                      else {
                        snprintf((char *)&local_138,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \" $ARCS {\") == 0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                 ,0x255);
                        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_00,(char *)&local_138);
                      }
                    }
                    else {
                      snprintf((char *)&local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" $NA { %d } ;\", &NA) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                               ,0x253);
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,(char *)&local_138);
                    }
                  }
                  else {
                    snprintf((char *)&local_138,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" $NV { %d } ;\", &NV) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x251);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,(char *)&local_138);
                  }
                }
                else {
                  snprintf((char *)&local_138,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" $LOSS { %d } ;\", &LOSS) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                           ,0x24f);
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,(char *)&local_138);
                }
              }
              else {
                snprintf((char *)&local_138,0x100,
                         "AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \" } ;\") == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                         ,0x24d);
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,(char *)&local_138);
              }
            }
            else {
              snprintf((char *)&local_138,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" $Ts { \") == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                       ,0x248);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,(char *)&local_138);
            }
          }
          else {
            snprintf((char *)&local_138,0x100,
                     "AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \" $S { %d } ;\", &S) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                     ,0x245);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,(char *)&local_138);
          }
        }
        else {
          snprintf((char *)&local_138,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "nbtypes == inst.nbtypes",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                   ,0x243);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(char *)&local_138);
        }
      }
      else {
        snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \" $NBTYPES { %d } ;\", &nbtypes) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x242);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(char *)&local_138);
      }
    }
    else {
      snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" #GRAPH_BEGIN#\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x23f);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(char *)&local_138);
    }
  }
  else {
    snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x23c);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(char *)&local_138);
  }
LAB_0010d155:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::read(FILE *fin) {
	throw_assert(ready == false);
	tstart = CURTIME;
	inst = Instance(fin);
	throw_assert(fscanf(fin, " #GRAPH_BEGIN#") == 0);

	int nbtypes;
	throw_assert(fscanf(fin, " $NBTYPES { %d } ;", &nbtypes) == 1);
	throw_assert(nbtypes == inst.nbtypes);

	throw_assert(fscanf(fin, " $S { %d } ;", &S) == 1);

	Ts.resize(nbtypes);
	throw_assert(fscanf(fin, " $Ts { ") == 0);
	for (int i = 0; i < nbtypes; i++) {
		if (i) throw_assert(fscanf(fin, " ,") == 0);
		throw_assert(fscanf(fin, "%d", &Ts[i]) == 1);
	}
	throw_assert(fscanf(fin, " } ;") == 0);

	throw_assert(fscanf(fin, " $LOSS { %d } ;", &LOSS) == 1);

	throw_assert(fscanf(fin, " $NV { %d } ;", &NV) == 1);

	throw_assert(fscanf(fin, " $NA { %d } ;", &NA) == 1);

	throw_assert(fscanf(fin, " $ARCS {") == 0);
	for (int i = 0; i < NA; i++) {
		int i_u, i_v, label;
		throw_assert(fscanf(fin, " %d %d %d ", &i_u, &i_v, &label) == 3);
		A.push_back(Arc(i_u, i_v, label));
	}
	throw_assert(fscanf(fin, " } ;") == 0);
	throw_assert(fscanf(fin, " #GRAPH_END#") == 0);
	ready = true;
}